

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

int nni_sock_add_dialer(nni_sock *s,nni_dialer *d)

{
  nni_mtx *mtx;
  nni_type t;
  char *name;
  int iVar1;
  long lVar2;
  undefined1 local_48 [8];
  uint64_t val;
  nni_dialer *local_38;
  
  iVar1 = nni_dialer_hold(d);
  if (iVar1 == 0) {
    local_38 = d;
    for (lVar2 = 8; lVar2 != 0x38; lVar2 = lVar2 + 0x10) {
      name = *(char **)(pipe_stats_init_listener_info + lVar2 + 0x18);
      t = *(nni_type *)((long)&ep_options[0].eo_name + lVar2);
      iVar1 = nni_sock_getopt(s,name,local_48,(size_t *)0x0,t);
      if (iVar1 == 0) {
        iVar1 = nni_dialer_setopt(local_38,name,local_48,0,t);
      }
      if ((iVar1 != 0) && (iVar1 != 9)) {
        nni_dialer_rele(local_38);
        val._4_4_ = iVar1;
      }
      if ((iVar1 != 9) && (iVar1 != 0)) {
        return val._4_4_;
      }
    }
    mtx = &s->s_mx;
    nni_mtx_lock(mtx);
    if (s->s_closing == true) {
      nni_mtx_unlock(mtx);
      nni_dialer_rele(local_38);
      iVar1 = 7;
    }
    else {
      nni_list_append(&s->s_dialers,local_38);
      nni_stat_inc(&s->st_dialers,1);
      nni_mtx_unlock(mtx);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
nni_sock_add_dialer(nni_sock *s, nni_dialer *d)
{
	int rv;

	// grab a hold on the dialer for the socket
	if ((rv = nni_dialer_hold(d)) != 0) {
		return (rv);
	}
	// copy initial values for some options from socket
	for (int i = 0; ep_options[i].eo_name != NULL; i++) {
		uint64_t             val; // big enough
		const nni_ep_option *o = &ep_options[i];
		rv = nni_sock_getopt(s, o->eo_name, &val, NULL, o->eo_type);
		if (rv == 0) {
			rv = nni_dialer_setopt(
			    d, o->eo_name, &val, 0, o->eo_type);
		}
		if (rv != 0 && rv != NNG_ENOTSUP) {
			nni_dialer_rele(d);
			return (rv);
		}
	}

	nni_mtx_lock(&s->s_mx);
	if (s->s_closing) {
		nni_mtx_unlock(&s->s_mx);
		nni_dialer_rele(d);
		return (NNG_ECLOSED);
	}

	nni_list_append(&s->s_dialers, d);

#ifdef NNG_ENABLE_STATS
	nni_stat_inc(&s->st_dialers, 1);
#endif

	nni_mtx_unlock(&s->s_mx);
	return (0);
}